

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_value.cpp
# Opt level: O3

void duckdb::ArrayValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t iVar1;
  LogicalType *target_type;
  reference pvVar2;
  Vector *vector;
  size_type __n;
  idx_t index;
  long lVar3;
  ulong uVar4;
  idx_t col_idx;
  LogicalType array_type;
  Value val;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  LogicalType::LogicalType(&local_c8,&result->type);
  target_type = ArrayType::GetChildType(&local_c8);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
  }
  else {
    __n = 0;
    do {
      pvVar2 = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
      if (pvVar2->vector_type != CONSTANT_VECTOR) {
        Vector::SetVectorType(result,FLAT_VECTOR);
      }
      __n = __n + 1;
      uVar4 = ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (__n < uVar4);
  }
  iVar1 = args->count;
  vector = ArrayVector::GetEntry(result);
  if (1 < uVar4) {
    FlatVector::VerifyFlatVector(vector);
    ValidityMask::Resize(&vector->validity,iVar1 * uVar4);
  }
  if (iVar1 != 0) {
    lVar3 = 0;
    index = 0;
    do {
      if (uVar4 != 0) {
        col_idx = 0;
        do {
          DataChunk::GetValue(&local_b0,args,col_idx,index);
          Value::DefaultCastAs(&local_70,&local_b0,target_type,false);
          Value::~Value(&local_b0);
          Vector::SetValue(vector,lVar3 + col_idx,&local_70);
          Value::~Value(&local_70);
          col_idx = col_idx + 1;
        } while (uVar4 != col_idx);
      }
      index = index + 1;
      lVar3 = lVar3 + uVar4;
    } while (index != iVar1);
  }
  Vector::Verify(result,args->count);
  LogicalType::~LogicalType(&local_c8);
  return;
}

Assistant:

static void ArrayValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto array_type = result.GetType();

	D_ASSERT(array_type.id() == LogicalTypeId::ARRAY);
	D_ASSERT(args.ColumnCount() == ArrayType::GetSize(array_type));

	auto &child_type = ArrayType::GetChildType(array_type);

	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}

	auto num_rows = args.size();
	auto num_columns = args.ColumnCount();

	auto &child = ArrayVector::GetEntry(result);

	if (num_columns > 1) {
		// Ensure that the child has a validity mask of the correct size
		// The SetValue call below expects the validity mask to be initialized
		auto &child_validity = FlatVector::Validity(child);
		child_validity.Resize(num_rows * num_columns);
	}

	for (idx_t i = 0; i < num_rows; i++) {
		for (idx_t j = 0; j < num_columns; j++) {
			auto val = args.GetValue(j, i).DefaultCastAs(child_type);
			child.SetValue((i * num_columns) + j, val);
		}
	}

	result.Verify(args.size());
}